

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O2

int beast::lexicalCastThrow<int,char*>(char *in)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined8 *puVar2;
  int out;
  
  out = (int)((ulong)in_RAX >> 0x20);
  bVar1 = lexicalCastChecked<int,char*>(&out,in);
  if (bVar1) {
    return out;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_002f9568;
  __cxa_throw(puVar2,&BadLexicalCast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

Out lexicalCastThrow (In in)
{
    Out out;

    if (lexicalCastChecked (out, in))
        return out;

    throw BadLexicalCast ();
}